

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SySetAlloc(SySet *pSet,sxi32 nItem)

{
  void *pvVar1;
  sxu32 local_1c;
  sxi32 nItem_local;
  SySet *pSet_local;
  
  if (pSet->nSize == 0) {
    local_1c = nItem;
    if (nItem < 8) {
      local_1c = 8;
    }
    pvVar1 = SyMemBackendAlloc(pSet->pAllocator,pSet->eSize * local_1c);
    pSet->pBase = pvVar1;
    if (pSet->pBase == (void *)0x0) {
      pSet_local._4_4_ = -1;
    }
    else {
      pSet->nSize = local_1c;
      pSet_local._4_4_ = 0;
    }
  }
  else {
    pSet_local._4_4_ = -4;
  }
  return pSet_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SySetAlloc(SySet *pSet, sxi32 nItem)
{
	if( pSet->nSize > 0 ){
		return SXERR_LOCKED;
	}
	if( nItem < 8 ){
		nItem = 8;
	}
	pSet->pBase = SyMemBackendAlloc(pSet->pAllocator, pSet->eSize * nItem);
	if( pSet->pBase == 0 ){
		return SXERR_MEM;
	}
	pSet->nSize = nItem;
	return SXRET_OK;
}